

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::ByteSizeLong(MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
               *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  uint uVar5;
  
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8);
  uVar5 = uVar1 | 1;
  iVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
  sVar4 = CoreML::Specification::MILSpec::Function::ByteSizeLong
                    ((Function *)CONCAT44(extraout_var_00,iVar3));
  uVar5 = (uint)sVar4 | 1;
  iVar3 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  return (ulong)(iVar3 * 9 + 0x49U >> 6) + (long)(int)((iVar2 * 9 + 0x49U >> 6) + uVar1) + sVar4 + 2
  ;
}

Assistant:

size_t ByteSizeLong() const override {
    size_t size = 0;
    size += kTagSize + static_cast<size_t>(KeyTypeHandler::ByteSize(key()));
    size += kTagSize + static_cast<size_t>(ValueTypeHandler::ByteSize(value()));
    return size;
  }